

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

ctmbstr FindStyle(TidyDocImpl *doc,ctmbstr tag,ctmbstr properties)

{
  Lexer *pLVar1;
  int iVar2;
  TagStyle *pTVar3;
  tmbstr ptVar4;
  TagStyle *local_38;
  TagStyle *style;
  Lexer *lexer;
  ctmbstr properties_local;
  ctmbstr tag_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  local_38 = pLVar1->styles;
  while( true ) {
    if (local_38 == (TagStyle *)0x0) {
      pTVar3 = (TagStyle *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x20);
      ptVar4 = prvTidytmbstrdup(doc->allocator,tag);
      pTVar3->tag = ptVar4;
      ptVar4 = GensymClass(doc);
      pTVar3->tag_class = ptVar4;
      ptVar4 = prvTidytmbstrdup(doc->allocator,properties);
      pTVar3->properties = ptVar4;
      pTVar3->next = pLVar1->styles;
      pLVar1->styles = pTVar3;
      return pTVar3->tag_class;
    }
    iVar2 = prvTidytmbstrcmp(local_38->tag,tag);
    if ((iVar2 == 0) && (iVar2 = prvTidytmbstrcmp(local_38->properties,properties), iVar2 == 0))
    break;
    local_38 = local_38->next;
  }
  return local_38->tag_class;
}

Assistant:

static ctmbstr FindStyle( TidyDocImpl* doc, ctmbstr tag, ctmbstr properties )
{
    Lexer* lexer = doc->lexer;
    TagStyle* style;

    for (style = lexer->styles; style; style=style->next)
    {
        if (TY_(tmbstrcmp)(style->tag, tag) == 0 &&
            TY_(tmbstrcmp)(style->properties, properties) == 0)
            return style->tag_class;
    }

    style = (TagStyle *)TidyDocAlloc( doc, sizeof(TagStyle) );
    style->tag = TY_(tmbstrdup)(doc->allocator, tag);
    style->tag_class = GensymClass( doc );
    style->properties = TY_(tmbstrdup)( doc->allocator, properties );
    style->next = lexer->styles;
    lexer->styles = style;
    return style->tag_class;
}